

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,OpaqueType *type)

{
  UnsupportedType *this_00;
  string local_40;
  
  if (this->m_exporter->m_opaque_as_any == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_namespace,0,(char *)(this->m_namespace)._M_string_length,0x118426);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_front,0,(char *)(this->m_front)._M_string_length,0x118127);
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"opaque types are not allowed in IDL","");
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_40);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(OpaqueType const& type)
    {
        if (m_exporter.marshalOpaquesAsAny())
        {
            m_namespace = "";
            m_front = "any";
        }
        else
            throw UnsupportedType(type, "opaque types are not allowed in IDL");

        return true;
    }